

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u32 tabOpts,Select *pSelect)

{
  byte *pbVar1;
  byte bVar2;
  i16 iVar3;
  Pgno PVar4;
  Table *pTab;
  sqlite3 *db;
  undefined8 uVar5;
  sqlite3 *db_00;
  Index *pIdx;
  i16 *aiCol;
  _func_sqlite3_str_ptr_sqlite3_ptr *z;
  short sVar6;
  LogEst LVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  Expr *pEVar15;
  void *pvVar16;
  Vdbe *pVVar17;
  Op *pOVar18;
  Token *pTVar19;
  ExprList *pList;
  Parse *pPVar20;
  Index *pIVar21;
  Table *pTable;
  u8 *puVar22;
  char *pcVar23;
  char *pcVar24;
  char *pcVar25;
  uint uVar26;
  Index **ppIVar27;
  char *zBuf;
  char *zFormat;
  char *pcVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  Column *pCVar33;
  long lVar34;
  bool bVar35;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 uVar36;
  char local_ac;
  u8 *local_90;
  SelectDest dest;
  
  if (pEnd == (Token *)0x0 && pSelect == (Select *)0x0) {
    return;
  }
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) {
    return;
  }
  db = pParse->db;
  if (pSelect == (Select *)0x0) {
    iVar9 = sqlite3ShadowTableName(db,pTab->zName);
    if (iVar9 != 0) {
      pbVar1 = (byte *)((long)&pTab->tabFlags + 1);
      *pbVar1 = *pbVar1 | 0x10;
    }
    if ((db->init).busy != '\0') {
      PVar4 = (db->init).newTnum;
      if (pTab->eTabType == '\0') {
        pTab->tnum = PVar4;
        if (PVar4 == 1) {
          *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags | 1;
        }
      }
      else {
        if (PVar4 != 0) goto LAB_00181c22;
        pTab->tnum = 0;
      }
    }
  }
  else if ((db->init).busy != '\0') {
LAB_00181c22:
    pcVar28 = "";
    goto LAB_00181c29;
  }
  local_90 = &(db->init).busy;
  if ((tabOpts >> 0x10 & 1) != 0) {
    pbVar1 = (byte *)((long)&pTab->tabFlags + 2);
    *pbVar1 = *pbVar1 | 1;
    lVar31 = 0;
    for (uVar30 = 0; (long)uVar30 < (long)pTab->nCol; uVar30 = uVar30 + 1) {
      pCVar33 = pTab->aCol;
      bVar2 = (&pCVar33->field_0x8)[lVar31];
      if (bVar2 < 0x10) {
        pcVar28 = pTab->zName;
        uVar5 = *(undefined8 *)((long)&pCVar33->zCnName + lVar31);
        if ((*(byte *)((long)&pCVar33->colFlags + lVar31) & 4) == 0) {
          sqlite3ErrorMsg(pParse,"missing datatype for %s.%s",pcVar28,uVar5);
          return;
        }
        pcVar23 = sqlite3ColumnType((Column *)((long)&pCVar33->zCnName + lVar31),"");
        sqlite3ErrorMsg(pParse,"unknown datatype for %s.%s: \"%s\"",pcVar28,uVar5,pcVar23);
        return;
      }
      if ((bVar2 & 0xf0) == 0x10) {
        (&pCVar33->affinity)[lVar31] = 'A';
      }
      if ((((*(byte *)((long)&pCVar33->colFlags + lVar31) & 1) != 0) &&
          (uVar30 != (uint)(int)pTab->iPKey)) && ((bVar2 & 0xf) == 0)) {
        (&pCVar33->field_0x8)[lVar31] = bVar2 | 2;
        pbVar1 = (byte *)((long)&pTab->tabFlags + 1);
        *pbVar1 = *pbVar1 | 8;
      }
      lVar31 = lVar31 + 0x10;
    }
  }
  local_ac = (char)tabOpts;
  if (local_ac < '\0') {
    uVar14 = pTab->tabFlags;
    if ((uVar14 & 8) != 0) {
      pcVar28 = "AUTOINCREMENT not allowed on WITHOUT ROWID tables";
LAB_00181c29:
      sqlite3ErrorMsg(pParse,pcVar28);
      return;
    }
    if ((uVar14 & 4) == 0) {
      sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
      return;
    }
    pTab->tabFlags = uVar14 | 0x280;
    db_00 = pParse->db;
    pVVar17 = pParse->pVdbe;
    if (((db_00->init).field_0x6 & 2) == 0) {
      lVar31 = 8;
      for (lVar34 = 0; lVar34 < pTab->nCol; lVar34 = lVar34 + 1) {
        pCVar33 = pTab->aCol;
        if (((*(byte *)((long)&pCVar33->zCnName + lVar31 + 6) & 1) != 0) &&
           (bVar2 = *(byte *)((long)&pCVar33->zCnName + lVar31), (bVar2 & 0xf) == 0)) {
          *(byte *)((long)&pCVar33->zCnName + lVar31) = bVar2 | 2;
        }
        lVar31 = lVar31 + 0x10;
      }
      pbVar1 = (byte *)((long)&pTab->tabFlags + 1);
      *pbVar1 = *pbVar1 | 8;
    }
    if ((long)(pParse->u1).addrCrTab != 0) {
      if (pVVar17->db->mallocFailed == '\0') {
        pOVar18 = pVVar17->aOp + (pParse->u1).addrCrTab;
      }
      else {
        pOVar18 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar18->p3 = 2;
    }
    if ((long)pTab->iPKey < 0) {
      pIVar21 = sqlite3PrimaryKeyIndex(pTab);
      iVar9 = 1;
      for (uVar30 = 1; uVar30 < pIVar21->nKeyCol; uVar30 = uVar30 + 1) {
        iVar29 = isDupColumn(pIVar21,iVar9,pIVar21,(int)uVar30);
        if (iVar29 == 0) {
          pIVar21->azColl[iVar9] = pIVar21->azColl[uVar30];
          pIVar21->aSortOrder[iVar9] = pIVar21->aSortOrder[uVar30];
          pIVar21->aiColumn[iVar9] = pIVar21->aiColumn[uVar30];
          iVar9 = iVar9 + 1;
        }
        else {
          pIVar21->nColumn = pIVar21->nColumn - 1;
        }
      }
      pIVar21->nKeyCol = (u16)iVar9;
LAB_0018243d:
      uVar8 = *(ushort *)&pIVar21->field_0x63;
      *(ushort *)&pIVar21->field_0x63 = uVar8 | 0x20;
      if (((db_00->init).field_0x6 & 2) == 0) {
        *(ushort *)&pIVar21->field_0x63 = uVar8 | 0x28;
      }
      uVar8 = pIVar21->nKeyCol;
      uVar30 = (ulong)uVar8;
      pIVar21->nColumn = uVar8;
      if ((pVVar17 != (Vdbe *)0x0) && ((long)(int)pIVar21->tnum != 0)) {
        if (pVVar17->db->mallocFailed == '\0') {
          pOVar18 = pVVar17->aOp + (int)pIVar21->tnum;
        }
        else {
          pOVar18 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar18->opcode = '\t';
      }
      pIVar21->tnum = pTab->tnum;
      uVar14 = (uint)uVar8;
      ppIVar27 = &pTab->pIndex;
      while (pIdx = *ppIVar27, pIdx != (Index *)0x0) {
        if ((*(ushort *)&pIdx->field_0x63 & 3) != 2) {
          iVar9 = 0;
          for (uVar26 = 0; uVar14 != uVar26; uVar26 = uVar26 + 1) {
            uVar12 = isDupColumn(pIdx,(uint)pIdx->nKeyCol,pIVar21,uVar26);
            iVar9 = iVar9 + (uVar12 ^ 1);
          }
          if (iVar9 == 0) {
            pIdx->nColumn = pIdx->nKeyCol;
          }
          else {
            iVar9 = resizeIndexObject(db_00,pIdx,iVar9 + (uint)pIdx->nKeyCol);
            if (iVar9 != 0) goto LAB_00181ce5;
            uVar26 = (uint)pIdx->nKeyCol;
            for (uVar32 = 0; uVar30 != uVar32; uVar32 = uVar32 + 1) {
              iVar9 = isDupColumn(pIdx,(uint)pIdx->nKeyCol,pIVar21,(int)uVar32);
              if (iVar9 == 0) {
                pIdx->aiColumn[(int)uVar26] = pIVar21->aiColumn[uVar32];
                pIdx->azColl[(int)uVar26] = pIVar21->azColl[uVar32];
                if (pIVar21->aSortOrder[uVar32] != '\0') {
                  pIdx->field_0x64 = pIdx->field_0x64 | 2;
                }
                uVar26 = uVar26 + 1;
              }
            }
          }
        }
        ppIVar27 = &pIdx->pNext;
      }
      uVar8 = pTab->nCol;
      uVar32 = 0;
      if ((short)uVar8 < 1) {
        uVar8 = 0;
      }
      lVar31 = 0xe;
      iVar9 = 0;
      for (; uVar8 != uVar32; uVar32 = uVar32 + 1) {
        iVar29 = hasColumn(pIVar21->aiColumn,uVar14,(int)uVar32);
        if (iVar29 == 0) {
          iVar9 = iVar9 + (uint)((*(byte *)((long)&pTab->aCol->zCnName + lVar31) & 0x20) == 0);
        }
        lVar31 = lVar31 + 0x10;
      }
      iVar9 = resizeIndexObject(db_00,pIVar21,iVar9 + uVar14);
      if (iVar9 == 0) {
        lVar31 = 0xe;
        for (lVar34 = 0; lVar34 < pTab->nCol; lVar34 = lVar34 + 1) {
          aiCol = pIVar21->aiColumn;
          iVar29 = (int)uVar30;
          iVar9 = hasColumn(aiCol,iVar29,(int)lVar34);
          if ((iVar9 == 0) && ((*(byte *)((long)&pTab->aCol->zCnName + lVar31) & 0x20) == 0)) {
            aiCol[iVar29] = (i16)lVar34;
            pIVar21->azColl[iVar29] = "BINARY";
            uVar30 = (ulong)(iVar29 + 1);
          }
          lVar31 = lVar31 + 0x10;
        }
        recomputeColumnsNotIndexed(pIVar21);
      }
    }
    else {
      dest._0_8_ = pTab->aCol[pTab->iPKey].zCnName;
      dest.iSDParm2 = sqlite3Strlen30((char *)dest._0_8_);
      pEVar15 = sqlite3ExprAlloc(db_00,0x3b,(Token *)&dest,0);
      pList = sqlite3ExprListAppendNew(pParse->db,pEVar15);
      if (pList != (ExprList *)0x0) {
        if (1 < pParse->eParseMode) {
          sqlite3RenameTokenRemap(pParse,pList->a[0].pExpr,&pTab->iPKey);
        }
        pList->a[0].fg.sortFlags = pParse->iPkSortOrder;
        pTab->iPKey = -1;
        in_stack_ffffffffffffff18 = 0;
        sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,(uint)pTab->keyConf
                           ,(Token *)0x0,(Expr *)0x0,0,0,'\x02');
        if (pParse->nErr == 0) {
          pIVar21 = sqlite3PrimaryKeyIndex(pTab);
          goto LAB_0018243d;
        }
      }
      *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags & 0x7f;
    }
  }
LAB_00181ce5:
  iVar9 = sqlite3SchemaToIndex(db,pTab->pSchema);
  if ((pTab->pCheck != (ExprList *)0x0) &&
     (sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck), pParse->nErr != 0)) {
    sqlite3ExprListDelete(db,pTab->pCheck);
    pTab->pCheck = (ExprList *)0x0;
  }
  if ((pTab->tabFlags & 0x60) == 0) {
    sVar6 = pTab->nCol;
  }
  else {
    lVar34 = 0;
    iVar29 = 0;
    for (lVar31 = 0; sVar6 = pTab->nCol, lVar31 < sVar6; lVar31 = lVar31 + 1) {
      if ((*(byte *)((long)&pTab->aCol->colFlags + lVar34) & 0x60) == 0) {
        iVar29 = iVar29 + 1;
      }
      else {
        pEVar15 = sqlite3ColumnExpr(pTab,(Column *)((long)&pTab->aCol->zCnName + lVar34));
        iVar10 = sqlite3ResolveSelfReference(pParse,pTab,8,pEVar15,(ExprList *)0x0);
        if (iVar10 != 0) {
          pCVar33 = pTab->aCol;
          pEVar15 = sqlite3ExprAlloc(db,0x79,(Token *)0x0,0);
          sqlite3ColumnSetExpr(pParse,pTab,(Column *)((long)&pCVar33->zCnName + lVar34),pEVar15);
        }
      }
      lVar34 = lVar34 + 0x10;
    }
    if (iVar29 == 0) {
      sqlite3ErrorMsg(pParse,"must have at least one non-generated column");
      return;
    }
  }
  puVar22 = &pTab->aCol->szEst;
  iVar10 = 0;
  for (iVar29 = (int)sVar6; 0 < iVar29; iVar29 = iVar29 + -1) {
    iVar10 = iVar10 + (uint)*puVar22;
    puVar22 = puVar22 + 0x10;
  }
  LVar7 = sqlite3LogEst((ulong)((iVar10 + (uint)((ushort)pTab->iPKey >> 0xf)) * 4));
  pTab->szTabRow = LVar7;
  ppIVar27 = &pTab->pIndex;
  while (pIVar21 = *ppIVar27, pIVar21 != (Index *)0x0) {
    estimateIndexWidth(pIVar21);
    ppIVar27 = &pIVar21->pNext;
  }
  if (*local_90 == '\0') {
    pVVar17 = sqlite3GetVdbe(pParse);
    if (pVVar17 == (Vdbe *)0x0) {
      return;
    }
    sqlite3VdbeAddOp1(pVVar17,0x7a,0);
    uVar36 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    bVar35 = pTab->eTabType == '\0';
    pcVar28 = "VIEW";
    if (bVar35) {
      pcVar28 = "TABLE";
    }
    pcVar23 = "view";
    if (bVar35) {
      pcVar23 = "table";
    }
    if (pSelect == (Select *)0x0) {
      pTVar19 = &pParse->sLastToken;
      if (tabOpts == 0) {
        pTVar19 = pEnd;
      }
      uVar14 = (int)pTVar19->z - (int)(pParse->sNameToken).z;
      if (*pTVar19->z != ';') {
        uVar14 = uVar14 + pTVar19->n;
      }
      pcVar28 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar28,(ulong)uVar14);
    }
    else {
      if (pParse->eParseMode != '\0') {
        pParse->rc = 1;
        pParse->nErr = pParse->nErr + 1;
        return;
      }
      iVar11 = pParse->nMem;
      iVar29 = iVar11 + 1;
      iVar10 = iVar11 + 3;
      pParse->nMem = iVar10;
      pPVar20 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar20 = pParse;
      }
      pPVar20->mayAbort = '\x01';
      sqlite3VdbeAddOp3(pVVar17,0x71,1,pParse->regRoot,iVar9);
      iVar13 = pVVar17->nOp;
      if (0 < (long)iVar13) {
        pVVar17->aOp[(long)iVar13 + -1].p5 = 0x10;
      }
      pParse->nTab = 2;
      sqlite3VdbeAddOp3(pVVar17,0xb,iVar29,0,iVar13 + 1);
      if (pParse->nErr != 0) {
        return;
      }
      pTable = sqlite3ResultSetOfSelect(pParse,pSelect,'A');
      if (pTable == (Table *)0x0) {
        return;
      }
      iVar3 = pTable->nCol;
      pTab->nNVCol = iVar3;
      pTab->nCol = iVar3;
      pTab->aCol = pTable->aCol;
      pTable->nCol = 0;
      pTable->aCol = (Column *)0x0;
      sqlite3DeleteTable(db,pTable);
      dest.eDest = '\r';
      dest.iSDParm = iVar29;
      dest.iSDParm2 = 0;
      dest.zAffSdst = (char *)0x0;
      dest.iSdst = 0;
      dest.nSdst = 0;
      sqlite3Select(pParse,pSelect,&dest);
      if (pParse->nErr != 0) {
        return;
      }
      sqlite3VdbeEndCoroutine(pVVar17,iVar29);
      sqlite3VdbeJumpHere(pVVar17,iVar13);
      iVar29 = sqlite3VdbeAddOp1(pVVar17,0xc,dest.iSDParm);
      sqlite3VdbeAddOp3(pVVar17,0x61,dest.iSdst,dest.nSdst,iVar11 + 2);
      lVar31 = 0;
      sqlite3TableAffinity(pVVar17,pTab,0);
      sqlite3VdbeAddOp2(pVVar17,0x7f,1,iVar10);
      sqlite3VdbeAddOp3(pVVar17,0x80,1,iVar11 + 2,iVar10);
      sqlite3VdbeGoto(pVVar17,iVar29);
      sqlite3VdbeJumpHere(pVVar17,iVar29);
      sqlite3VdbeAddOp1(pVVar17,0x7a,1);
      pCVar33 = pTab->aCol;
      sVar6 = pTab->nCol;
      iVar29 = 0;
      if (0 < sVar6) {
        iVar29 = (int)sVar6;
      }
      iVar10 = 0;
      for (; iVar29 << 4 != (int)lVar31; lVar31 = lVar31 + 0x10) {
        iVar11 = identLength(*(char **)((long)&pCVar33->zCnName + lVar31));
        iVar10 = iVar10 + iVar11 + 5;
      }
      iVar29 = identLength(pTab->zName);
      iVar29 = iVar29 + iVar10;
      pcVar24 = ",\n  ";
      if (iVar29 < 0x32) {
        pcVar24 = ",";
      }
      pcVar25 = "\n)";
      if (iVar29 < 0x32) {
        pcVar25 = ")";
      }
      iVar10 = sVar6 * 6 + iVar29 + 0x23;
      pcVar28 = (char *)sqlite3Malloc((long)iVar10);
      uVar36 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      if (pcVar28 == (char *)0x0) {
        sqlite3OomFault(db);
      }
      else {
        zFormat = "\n  ";
        if (iVar29 < 0x32) {
          zFormat = "";
        }
        sqlite3_snprintf(iVar10,pcVar28,"CREATE TABLE ");
        iVar29 = sqlite3Strlen30(pcVar28);
        dest._0_4_ = iVar29;
        identPut(pcVar28,(int *)&dest,pTab->zName);
        iVar29 = dest._0_4_ + 1;
        pcVar28[(int)dest._0_4_] = '(';
        pCVar33 = pTab->aCol;
        iVar11 = 0;
        while( true ) {
          uVar36 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
          zBuf = pcVar28 + iVar29;
          if (pTab->nCol <= iVar11) break;
          sqlite3_snprintf(iVar10 - iVar29,zBuf,zFormat);
          iVar13 = sqlite3Strlen30(zBuf);
          dest._0_4_ = iVar13 + iVar29;
          identPut(pcVar28,(int *)&dest,pCVar33->zCnName);
          z = (&sqlite3Apis.str_new)[pCVar33->affinity];
          uVar14 = sqlite3Strlen30((char *)z);
          uVar36 = dest._0_4_;
          memcpy(pcVar28 + (int)dest._0_4_,z,(ulong)uVar14);
          iVar29 = uVar14 + uVar36;
          dest._0_4_ = iVar29;
          iVar11 = iVar11 + 1;
          pCVar33 = pCVar33 + 1;
          zFormat = pcVar24;
        }
        sqlite3_snprintf(iVar10 - iVar29,zBuf,"%s",pcVar25);
      }
    }
    sqlite3NestedParse(pParse,
                       "UPDATE %Q.sqlite_master SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                       ,db->aDb[iVar9].zDbSName,pcVar23,pTab->zName,pTab->zName,
                       CONCAT44(uVar36,pParse->regRoot),pcVar28,pParse->regRowid);
    sqlite3DbFree(db,pcVar28);
    sqlite3ChangeCookie(pParse,iVar9);
    if ((((pTab->tabFlags & 8) != 0) && (pParse->eParseMode == '\0')) &&
       ((db->aDb[iVar9].pSchema)->pSeqTab == (Table *)0x0)) {
      sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",db->aDb[iVar9].zDbSName)
      ;
    }
    pcVar28 = sqlite3MPrintf(db,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
    sqlite3VdbeAddParseSchemaOp(pVVar17,iVar9,pcVar28,0);
    if ((db->init).busy == '\0') goto joined_r0x00182241;
  }
  pvVar16 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
  if (pvVar16 != (void *)0x0) {
    sqlite3OomFault(db);
    return;
  }
  pParse->pNewTable = (Table *)0x0;
  *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 1;
  iVar9 = strcmp(pTab->zName,"sqlite_sequence");
  if (iVar9 == 0) {
    pTab->pSchema->pSeqTab = pTab;
  }
joined_r0x00182241:
  if ((pSelect == (Select *)0x0) && (pTab->eTabType == '\0')) {
    if (pCons->z != (char *)0x0) {
      pEnd = pCons;
    }
    (pTab->u).tab.addColOffset = (*(int *)&pEnd->z - *(int *)&(pParse->sNameToken).z) + 0xd;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u32 tabOpts,            /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  p = pParse->pNewTable;
  if( p==0 ) return;

  if( pSelect==0 && sqlite3ShadowTableName(db, p->zName) ){
    p->tabFlags |= TF_Shadow;
  }

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_schema" or "sqlite_temp_schema" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_schema
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    if( pSelect || (!IsOrdinaryTable(p) && db->init.newTnum) ){
      sqlite3ErrorMsg(pParse, "");
      return;
    }
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  /* Special processing for tables that include the STRICT keyword:
  **
  **   *  Do not allow custom column datatypes.  Every column must have
  **      a datatype that is one of INT, INTEGER, REAL, TEXT, or BLOB.
  **
  **   *  If a PRIMARY KEY is defined, other than the INTEGER PRIMARY KEY,
  **      then all columns of the PRIMARY KEY must have a NOT NULL
  **      constraint.
  */
  if( tabOpts & TF_Strict ){
    int ii;
    p->tabFlags |= TF_Strict;
    for(ii=0; ii<p->nCol; ii++){
      Column *pCol = &p->aCol[ii];
      if( pCol->eCType==COLTYPE_CUSTOM ){
        if( pCol->colFlags & COLFLAG_HASTYPE ){
          sqlite3ErrorMsg(pParse,
            "unknown datatype for %s.%s: \"%s\"",
            p->zName, pCol->zCnName, sqlite3ColumnType(pCol, "")
          );
        }else{
          sqlite3ErrorMsg(pParse, "missing datatype for %s.%s",
                          p->zName, pCol->zCnName);
        }
        return;
      }else if( pCol->eCType==COLTYPE_ANY ){
        pCol->affinity = SQLITE_AFF_BLOB;
      }
      if( (pCol->colFlags & COLFLAG_PRIMKEY)!=0
       && p->iPKey!=ii
       && pCol->notNull == OE_None
      ){
        pCol->notNull = OE_Abort;
        p->tabFlags |= TF_HasNotNull;
      }
    }
  }

  assert( (p->tabFlags & TF_HasPrimaryKey)==0
       || p->iPKey>=0 || sqlite3PrimaryKeyIndex(p)!=0 );
  assert( (p->tabFlags & TF_HasPrimaryKey)!=0
       || (p->iPKey<0 && sqlite3PrimaryKeyIndex(p)==0) );

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
      return;
    }
    p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
    convertToWithoutRowidTable(pParse, p);
  }
  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
    if( pParse->nErr ){
      /* If errors are seen, delete the CHECK constraints now, else they might
      ** actually be used if PRAGMA writable_schema=ON is set. */
      sqlite3ExprListDelete(db, p->pCheck);
      p->pCheck = 0;
    }else{
      markExprListImmutable(p->pCheck);
    }
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
  if( p->tabFlags & TF_HasGenerated ){
    int ii, nNG = 0;
    testcase( p->tabFlags & TF_HasVirtual );
    testcase( p->tabFlags & TF_HasStored );
    for(ii=0; ii<p->nCol; ii++){
      u32 colFlags = p->aCol[ii].colFlags;
      if( (colFlags & COLFLAG_GENERATED)!=0 ){
        Expr *pX = sqlite3ColumnExpr(p, &p->aCol[ii]);
        testcase( colFlags & COLFLAG_VIRTUAL );
        testcase( colFlags & COLFLAG_STORED );
        if( sqlite3ResolveSelfReference(pParse, p, NC_GenCol, pX, 0) ){
          /* If there are errors in resolving the expression, change the
          ** expression to a NULL.  This prevents code generators that operate
          ** on the expression from inserting extra parts into the expression
          ** tree that have been allocated from lookaside memory, which is
          ** illegal in a schema and will lead to errors or heap corruption
          ** when the database connection closes. */
          sqlite3ColumnSetExpr(pParse, p, &p->aCol[ii],
               sqlite3ExprAlloc(db, TK_NULL, 0, 0));
        }
      }else{
        nNG++;
      }
    }
    if( nNG==0 ){
      sqlite3ErrorMsg(pParse, "must have at least one non-generated column");
      return;
    }
  }
#endif

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the schema table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /*
    ** Initialize zType for the new view or table.
    */
    if( IsOrdinaryTable(p) ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */

      if( IN_SPECIAL_PARSE ){
        pParse->rc = SQLITE_ERROR;
        pParse->nErr++;
        return;
      }
      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      assert(pParse->nTab==1);
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect, SQLITE_AFF_BLOB);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = p->nNVCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      if( pParse->nErr ) return;
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, 1, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, 1, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db,
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the
    ** schema table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q." LEGACY_SCHEMA_TABLE
      " SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q"
      " WHERE rowid=#%d",
      db->aDb[iDb].zDbSName,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 && !IN_SPECIAL_PARSE ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName),0);
  }

  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    assert( HasRowid(p) || p->iPKey<0 );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->mDbFlags |= DBFLAG_SchemaChange;

    /* If this is the magic sqlite_sequence table used by autoincrement,
    ** then record a pointer to this table in the main database structure
    ** so that INSERT can find the table easily.  */
    assert( !pParse->nested );
#ifndef SQLITE_OMIT_AUTOINCREMENT
    if( strcmp(p->zName, "sqlite_sequence")==0 ){
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      p->pSchema->pSeqTab = p;
    }
#endif
  }

#ifndef SQLITE_OMIT_ALTERTABLE
  if( !pSelect && IsOrdinaryTable(p) ){
    assert( pCons && pEnd );
    if( pCons->z==0 ){
      pCons = pEnd;
    }
    p->u.tab.addColOffset = 13 + (int)(pCons->z - pParse->sNameToken.z);
  }
#endif
}